

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall
t_netstd_generator::generate_netstd_struct_result_writer
          (t_netstd_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  t_field *tfield;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  pointer pptVar5;
  t_netstd_generator *ptVar6;
  string tmpvar;
  string name;
  string local_1b8;
  string local_198;
  t_struct *local_178;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_178 = tstruct;
  t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_130);
  poVar4 = std::operator<<(poVar4,
                           "public async global::System.Threading.Tasks.Task WriteAsync(TProtocol oprot, CancellationToken "
                          );
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,")");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_170);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_130);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_130);
  poVar4 = std::operator<<(poVar4,"oprot.IncrementRecursionDepth();");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_170);
  poVar4 = std::operator<<(poVar4,"try");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_1b8);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_130);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  iVar3 = (*(local_178->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string((string *)&local_130,(string *)CONCAT44(extraout_var,iVar3));
  std::__cxx11::string::string((string *)&local_f0,"tmp",(allocator *)&local_1b8);
  t_generator::tmp(&local_170,(t_generator *)this,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_1b8);
  poVar4 = std::operator<<(poVar4,"var ");
  poVar4 = std::operator<<(poVar4,(string *)&local_170);
  poVar4 = std::operator<<(poVar4," = new TStruct(\"");
  poVar4 = std::operator<<(poVar4,(string *)&local_130);
  poVar4 = std::operator<<(poVar4,"\");");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_198);
  poVar4 = std::operator<<(poVar4,"await oprot.WriteStructBeginAsync(");
  poVar4 = std::operator<<(poVar4,(string *)&local_170);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  if ((local_178->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (local_178->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::string::string((string *)&local_110,"tmp",(allocator *)&local_198);
    t_generator::tmp(&local_1b8,(t_generator *)this,&local_110);
    std::__cxx11::string::operator=((string *)&local_170,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_110);
    t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_1b8);
    poVar4 = std::operator<<(poVar4,"var ");
    poVar4 = std::operator<<(poVar4,(string *)&local_170);
    poVar4 = std::operator<<(poVar4," = new TField();");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b8);
    bVar2 = true;
    for (pptVar5 = (local_178->members_in_id_order_).
                   super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pptVar5 !=
        (local_178->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
      if (bVar2) {
        poVar4 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
        poVar4 = std::operator<<(poVar4,(string *)&local_1b8);
        std::operator<<(poVar4,"if");
      }
      else {
        t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
        poVar4 = std::operator<<(out,(string *)&local_1b8);
        std::operator<<(poVar4,"else if");
      }
      std::__cxx11::string::~string((string *)&local_1b8);
      poVar4 = std::operator<<(out,"(this.__isset.");
      std::__cxx11::string::string((string *)&local_70,(string *)&(*pptVar5)->name_);
      ptVar6 = this;
      normalize_name(&local_198,this,&local_70,false);
      get_isset_name(&local_1b8,ptVar6,&local_198);
      poVar4 = std::operator<<(poVar4,(string *)&local_1b8);
      poVar4 = std::operator<<(poVar4,")");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_150);
      poVar4 = std::operator<<(poVar4,"{");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_70);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      bVar2 = type_can_be_null((*pptVar5)->type_);
      if (bVar2) {
        t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
        poVar4 = std::operator<<(out,(string *)&local_1b8);
        poVar4 = std::operator<<(poVar4,"if (");
        prop_name_abi_cxx11_(&local_198,this,*pptVar5,false);
        poVar4 = std::operator<<(poVar4,(string *)&local_198);
        poVar4 = std::operator<<(poVar4," != null)");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
        poVar4 = std::operator<<(poVar4,(string *)&local_150);
        poVar4 = std::operator<<(poVar4,"{");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_1b8);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
      }
      t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_1b8);
      poVar4 = std::operator<<(poVar4,(string *)&local_170);
      poVar4 = std::operator<<(poVar4,".Name = \"");
      prop_name_abi_cxx11_(&local_198,this,*pptVar5,false);
      poVar4 = std::operator<<(poVar4,(string *)&local_198);
      poVar4 = std::operator<<(poVar4,"\";");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_150);
      poVar4 = std::operator<<(poVar4,(string *)&local_170);
      ptVar6 = (t_netstd_generator *)0x2f1577;
      poVar4 = std::operator<<(poVar4,".Type = ");
      type_to_enum_abi_cxx11_(&local_90,ptVar6,(*pptVar5)->type_);
      poVar4 = std::operator<<(poVar4,(string *)&local_90);
      poVar4 = std::operator<<(poVar4,";");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_b0);
      poVar4 = std::operator<<(poVar4,(string *)&local_170);
      poVar4 = std::operator<<(poVar4,".ID = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(*pptVar5)->key_);
      poVar4 = std::operator<<(poVar4,";");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_d0);
      poVar4 = std::operator<<(poVar4,"await oprot.WriteFieldBeginAsync(");
      poVar4 = std::operator<<(poVar4,(string *)&local_170);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,");");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_1b8);
      tfield = *pptVar5;
      std::__cxx11::string::string((string *)&local_50,"",(allocator *)&local_1b8);
      generate_serialize_field(this,out,tfield,&local_50,false);
      std::__cxx11::string::~string((string *)&local_50);
      t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_1b8);
      poVar4 = std::operator<<(poVar4,"await oprot.WriteFieldEndAsync(");
      poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,");");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1b8);
      if (bVar2) {
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
        poVar4 = std::operator<<(out,(string *)&local_1b8);
        poVar4 = std::operator<<(poVar4,"}");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_1b8);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_1b8);
      poVar4 = std::operator<<(poVar4,"}");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1b8);
      bVar2 = false;
    }
  }
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_1b8);
  poVar4 = std::operator<<(poVar4,"await oprot.WriteFieldStopAsync(");
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,");");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_198);
  poVar4 = std::operator<<(poVar4,"await oprot.WriteStructEndAsync(");
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_1b8);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_198);
  poVar4 = std::operator<<(poVar4,"finally");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_150);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_1b8);
  poVar4 = std::operator<<(poVar4,"oprot.DecrementRecursionDepth();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1b8);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_1b8);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1b8);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_1b8);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_130);
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_struct_result_writer(ostream& out, t_struct* tstruct)
{
    out << indent() << "public async global::System.Threading.Tasks.Task WriteAsync(TProtocol oprot, CancellationToken " << CANCELLATION_TOKEN_NAME << ")" << endl
        << indent() << "{" << endl;
    indent_up();

    out << indent() << "oprot.IncrementRecursionDepth();" << endl
        << indent() << "try" << endl
        << indent() << "{" << endl;
    indent_up();

    string name = tstruct->get_name();
    const vector<t_field*>& fields = tstruct->get_sorted_members();
    vector<t_field*>::const_iterator f_iter;

    string tmpvar = tmp("tmp");
    out << indent() << "var " << tmpvar << " = new TStruct(\"" << name << "\");" << endl
        << indent() << "await oprot.WriteStructBeginAsync(" << tmpvar << ", " << CANCELLATION_TOKEN_NAME << ");" << endl;

    if (fields.size() > 0)
    {
        tmpvar = tmp("tmp");
        out << indent() << "var " << tmpvar << " = new TField();" << endl;
        bool first = true;
        for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
        {
            if (first)
            {
                first = false;
                out << endl << indent() << "if";
            }
            else
            {
                out << indent() << "else if";
            }

            out << "(this.__isset." << get_isset_name(normalize_name((*f_iter)->get_name())) << ")" << endl
                << indent() << "{" << endl;
            indent_up();

            bool null_allowed = type_can_be_null((*f_iter)->get_type());
            if (null_allowed)
            {
                out << indent() << "if (" << prop_name(*f_iter) << " != null)" << endl
                    << indent() << "{" << endl;
                indent_up();
            }

            out << indent() << tmpvar << ".Name = \"" << prop_name(*f_iter) << "\";" << endl
                << indent() << tmpvar << ".Type = " << type_to_enum((*f_iter)->get_type()) << ";" << endl
                << indent() << tmpvar << ".ID = " << (*f_iter)->get_key() << ";" << endl
                << indent() << "await oprot.WriteFieldBeginAsync(" << tmpvar << ", " << CANCELLATION_TOKEN_NAME << ");" << endl;

            generate_serialize_field(out, *f_iter);

            out << indent() << "await oprot.WriteFieldEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;

            if (null_allowed)
            {
                indent_down();
                out << indent() << "}" << endl;
            }

            indent_down();
            out << indent() << "}" << endl;
        }
    }

    out << indent() << "await oprot.WriteFieldStopAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "await oprot.WriteStructEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    indent_down();
    out << indent() << "}" << endl
        << indent() << "finally" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "oprot.DecrementRecursionDepth();" << endl;
    indent_down();
    out << indent() << "}" << endl;
    indent_down();
    out << indent() << "}" << endl << endl;
}